

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpabortdescriptors.cpp
# Opt level: O0

void __thiscall jrtplib::RTPAbortDescriptors::Destroy(RTPAbortDescriptors *this)

{
  RTPAbortDescriptors *this_local;
  
  if ((this->m_init & 1U) != 0) {
    close(this->m_descriptors[0]);
    close(this->m_descriptors[1]);
    this->m_descriptors[0] = -1;
    this->m_descriptors[1] = -1;
    this->m_init = false;
  }
  return;
}

Assistant:

void RTPAbortDescriptors::Destroy()
{
	if (!m_init)
		return;

	close(m_descriptors[0]);
	close(m_descriptors[1]);
	m_descriptors[0] = RTPSOCKERR;
	m_descriptors[1] = RTPSOCKERR;

	m_init = false;
}